

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stored.c
# Opt level: O2

block_state deflate_stored(deflate_state *s,int flush)

{
  uint32_t uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  zng_stream *pzVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  block_state bVar10;
  uint uVar11;
  ulong uVar12;
  
  uVar5 = s->pending_buf_size - 5;
  if (s->w_size <= uVar5) {
    uVar5 = s->w_size;
  }
  uVar1 = s->strm->avail_in;
  do {
    uVar3 = s->bi_valid + 0x2a >> 3;
    pzVar6 = s->strm;
    bVar2 = true;
    uVar7 = pzVar6->avail_out - uVar3;
    if (pzVar6->avail_out < uVar3) goto LAB_0010769d;
    uVar3 = s->block_start;
    uVar8 = s->strstart;
    uVar11 = uVar8 - uVar3;
    uVar4 = pzVar6->avail_in + uVar11;
    uVar9 = 0xffff;
    if ((ulong)pzVar6->avail_in + (ulong)uVar11 < 0xffff) {
      uVar9 = uVar4;
    }
    if (uVar7 <= uVar9) {
      uVar9 = uVar7;
    }
    if ((uVar9 < uVar5) && (((flush != 4 && uVar9 == 0 || (uVar9 != uVar4)) || (flush == 0))))
    goto LAB_0010769d;
    bVar2 = uVar4 == uVar9;
    zng_tr_stored_block(s,(char *)0x0,0,(uint)(bVar2 && flush == 4));
    uVar7 = s->pending - 4;
    s->pending = uVar7;
    *(ushort *)(s->pending_buf + uVar7) = (ushort)uVar9;
    uVar7 = s->pending + 2;
    s->pending = uVar7;
    *(ushort *)(s->pending_buf + uVar7) = ~(ushort)uVar9;
    s->pending = s->pending + 2;
    zng_flush_pending(s->strm);
    if (uVar8 != uVar3) {
      if (uVar9 <= uVar11) {
        uVar11 = uVar9;
      }
      uVar12 = (ulong)uVar11;
      memcpy(s->strm->next_out,s->window + s->block_start,uVar12);
      pzVar6 = s->strm;
      pzVar6->next_out = pzVar6->next_out + uVar12;
      pzVar6->avail_out = pzVar6->avail_out - uVar11;
      pzVar6->total_out = pzVar6->total_out + uVar12;
      s->block_start = s->block_start + uVar11;
      uVar9 = uVar9 - uVar11;
    }
    if (uVar9 != 0) {
      zng_read_buf(s->strm,s->strm->next_out,uVar9);
      pzVar6 = s->strm;
      pzVar6->next_out = pzVar6->next_out + uVar9;
      pzVar6->avail_out = pzVar6->avail_out - uVar9;
      pzVar6->total_out = pzVar6->total_out + (ulong)uVar9;
    }
  } while (!bVar2 || flush != 4);
  pzVar6 = s->strm;
  bVar2 = false;
LAB_0010769d:
  uVar5 = uVar1 - pzVar6->avail_in;
  if (uVar5 == 0) {
    uVar3 = s->strstart;
  }
  else {
    uVar3 = s->w_size;
    uVar12 = (ulong)uVar3;
    if (uVar5 < uVar3) {
      uVar7 = s->strstart;
      if (s->window_size - uVar7 <= uVar5) {
        s->strstart = uVar7 - uVar3;
        memcpy(s->window,s->window + uVar12,(ulong)(uVar7 - uVar3));
        if (s->matches < 2) {
          s->matches = s->matches + 1;
        }
        uVar7 = s->strstart;
        uVar3 = s->insert;
        if (uVar7 <= s->insert) {
          uVar3 = uVar7;
        }
        s->insert = uVar3;
        pzVar6 = s->strm;
      }
      memcpy(s->window + uVar7,pzVar6->next_in + -(ulong)uVar5,(ulong)uVar5);
      uVar3 = s->strstart + uVar5;
      s->strstart = uVar3;
      uVar7 = s->w_size - s->insert;
      if (uVar5 < uVar7) {
        uVar7 = uVar5;
      }
      s->insert = uVar7 + s->insert;
    }
    else {
      s->matches = 2;
      memcpy(s->window,pzVar6->next_in + -uVar12,uVar12);
      uVar3 = s->w_size;
      s->strstart = uVar3;
      s->insert = uVar3;
    }
    s->block_start = uVar3;
  }
  uVar5 = s->high_water;
  if (s->high_water <= uVar3) {
    uVar5 = uVar3;
  }
  s->high_water = uVar5;
  if (bVar2) {
    if ((((flush & 0xfffffffbU) == 0) || (s->strm->avail_in != 0)) || (uVar3 != s->block_start)) {
      uVar7 = s->window_size - uVar3;
      pzVar6 = s->strm;
      uVar5 = pzVar6->avail_in;
      if (uVar7 < uVar5) {
        uVar8 = s->w_size;
        if ((int)uVar8 <= s->block_start) {
          s->block_start = s->block_start - uVar8;
          s->strstart = uVar3 - uVar8;
          memcpy(s->window,s->window + uVar8,(ulong)(uVar3 - uVar8));
          if (s->matches < 2) {
            s->matches = s->matches + 1;
          }
          uVar7 = uVar7 + s->w_size;
          uVar3 = s->strstart;
          uVar5 = s->insert;
          if (uVar3 <= s->insert) {
            uVar5 = uVar3;
          }
          s->insert = uVar5;
          pzVar6 = s->strm;
          uVar5 = pzVar6->avail_in;
        }
      }
      if (uVar7 < uVar5) {
        uVar5 = uVar7;
      }
      if (uVar5 == 0) {
        uVar7 = s->w_size;
      }
      else {
        zng_read_buf(pzVar6,s->window + uVar3,uVar5);
        uVar3 = s->strstart + uVar5;
        s->strstart = uVar3;
        uVar7 = s->w_size;
        uVar8 = uVar7 - s->insert;
        if (uVar5 < uVar8) {
          uVar8 = uVar5;
        }
        s->insert = uVar8 + s->insert;
      }
      uVar5 = s->high_water;
      if (s->high_water <= uVar3) {
        uVar5 = uVar3;
      }
      s->high_water = uVar5;
      uVar5 = s->pending_buf_size - (s->bi_valid + 0x2a >> 3);
      if (0xfffe < uVar5) {
        uVar5 = 0xffff;
      }
      if (uVar5 < uVar7) {
        uVar7 = uVar5;
      }
      uVar8 = s->block_start;
      uVar9 = uVar3 - uVar8;
      if (uVar9 < uVar7) {
        if (flush == 0) {
          return need_more;
        }
        if (flush != 4 && uVar3 == uVar8) {
          return need_more;
        }
        if (s->strm->avail_in != 0) {
          return need_more;
        }
      }
      uVar1 = uVar5;
      if (uVar9 < uVar5) {
        uVar1 = uVar9;
      }
      uVar3 = 0;
      if ((flush == 4) && (s->strm->avail_in == 0)) {
        uVar3 = (uint)(uVar9 <= uVar5);
      }
      zng_tr_stored_block(s,(char *)(s->window + (int)uVar8),uVar1,uVar3);
      s->block_start = s->block_start + uVar1;
      zng_flush_pending(s->strm);
      bVar10 = uVar3 * 2;
    }
    else {
      bVar10 = block_done;
    }
  }
  else {
    bVar10 = finish_done;
  }
  return bVar10;
}

Assistant:

Z_INTERNAL block_state deflate_stored(deflate_state *s, int flush) {
    /* Smallest worthy block size when not flushing or finishing. By default
     * this is 32K. This can be as small as 507 bytes for memLevel == 1. For
     * large input and output buffers, the stored block size will be larger.
     */
    unsigned min_block = MIN(s->pending_buf_size - 5, s->w_size);

    /* Copy as many min_block or larger stored blocks directly to next_out as
     * possible. If flushing, copy the remaining available input to next_out as
     * stored blocks, if there is enough space.
     */
    unsigned len, left, have, last = 0;
    unsigned used = s->strm->avail_in;
    do {
        /* Set len to the maximum size block that we can copy directly with the
         * available input data and output space. Set left to how much of that
         * would be copied from what's left in the window.
         */
        len = MAX_STORED;       /* maximum deflate stored block length */
        have = (s->bi_valid + 42) >> 3;         /* number of header bytes */
        if (s->strm->avail_out < have)          /* need room for header */
            break;
            /* maximum stored block length that will fit in avail_out: */
        have = s->strm->avail_out - have;
        left = (int)s->strstart - s->block_start;    /* bytes left in window */
        if (len > (unsigned long)left + s->strm->avail_in)
            len = left + s->strm->avail_in;     /* limit len to the input */
        len = MIN(len, have);                   /* limit len to the output */

        /* If the stored block would be less than min_block in length, or if
         * unable to copy all of the available input when flushing, then try
         * copying to the window and the pending buffer instead. Also don't
         * write an empty block when flushing -- deflate() does that.
         */
        if (len < min_block && ((len == 0 && flush != Z_FINISH) || flush == Z_NO_FLUSH || len != left + s->strm->avail_in))
            break;

        /* Make a dummy stored block in pending to get the header bytes,
         * including any pending bits. This also updates the debugging counts.
         */
        last = flush == Z_FINISH && len == left + s->strm->avail_in ? 1 : 0;
        zng_tr_stored_block(s, (char *)0, 0L, last);

        /* Replace the lengths in the dummy stored block with len. */
        s->pending -= 4;
        put_short(s, (uint16_t)len);
        put_short(s, (uint16_t)~len);

        /* Write the stored block header bytes. */
        PREFIX(flush_pending)(s->strm);

        /* Update debugging counts for the data about to be copied. */
        cmpr_bits_add(s, len << 3);
        sent_bits_add(s, len << 3);

        /* Copy uncompressed bytes from the window to next_out. */
        if (left) {
            left = MIN(left, len);
            memcpy(s->strm->next_out, s->window + s->block_start, left);
            s->strm->next_out += left;
            s->strm->avail_out -= left;
            s->strm->total_out += left;
            s->block_start += (int)left;
            len -= left;
        }

        /* Copy uncompressed bytes directly from next_in to next_out, updating
         * the check value.
         */
        if (len) {
            PREFIX(read_buf)(s->strm, s->strm->next_out, len);
            s->strm->next_out += len;
            s->strm->avail_out -= len;
            s->strm->total_out += len;
        }
    } while (last == 0);

    /* Update the sliding window with the last s->w_size bytes of the copied
     * data, or append all of the copied data to the existing window if less
     * than s->w_size bytes were copied. Also update the number of bytes to
     * insert in the hash tables, in the event that deflateParams() switches to
     * a non-zero compression level.
     */
    used -= s->strm->avail_in;      /* number of input bytes directly copied */
    if (used) {
        /* If any input was used, then no unused input remains in the window,
         * therefore s->block_start == s->strstart.
         */
        if (used >= s->w_size) {    /* supplant the previous history */
            s->matches = 2;         /* clear hash */
            memcpy(s->window, s->strm->next_in - s->w_size, s->w_size);
            s->strstart = s->w_size;
            s->insert = s->strstart;
        } else {
            if (s->window_size - s->strstart <= used) {
                /* Slide the window down. */
                s->strstart -= s->w_size;
                memcpy(s->window, s->window + s->w_size, s->strstart);
                if (s->matches < 2)
                    s->matches++;   /* add a pending slide_hash() */
                s->insert = MIN(s->insert, s->strstart);
            }
            memcpy(s->window + s->strstart, s->strm->next_in - used, used);
            s->strstart += used;
            s->insert += MIN(used, s->w_size - s->insert);
        }
        s->block_start = (int)s->strstart;
    }
    s->high_water = MAX(s->high_water, s->strstart);

    /* If the last block was written to next_out, then done. */
    if (last)
        return finish_done;

    /* If flushing and all input has been consumed, then done. */
    if (flush != Z_NO_FLUSH && flush != Z_FINISH && s->strm->avail_in == 0 && (int)s->strstart == s->block_start)
        return block_done;

    /* Fill the window with any remaining input. */
    have = s->window_size - s->strstart;
    if (s->strm->avail_in > have && s->block_start >= (int)s->w_size) {
        /* Slide the window down. */
        s->block_start -= (int)s->w_size;
        s->strstart -= s->w_size;
        memcpy(s->window, s->window + s->w_size, s->strstart);
        if (s->matches < 2)
            s->matches++;           /* add a pending slide_hash() */
        have += s->w_size;          /* more space now */
        s->insert = MIN(s->insert, s->strstart);
    }

    have = MIN(have, s->strm->avail_in);
    if (have) {
        PREFIX(read_buf)(s->strm, s->window + s->strstart, have);
        s->strstart += have;
        s->insert += MIN(have, s->w_size - s->insert);
    }
    s->high_water = MAX(s->high_water, s->strstart);

    /* There was not enough avail_out to write a complete worthy or flushed
     * stored block to next_out. Write a stored block to pending instead, if we
     * have enough input for a worthy block, or if flushing and there is enough
     * room for the remaining input as a stored block in the pending buffer.
     */
    have = (s->bi_valid + 42) >> 3;         /* number of header bytes */
        /* maximum stored block length that will fit in pending: */
    have = MIN(s->pending_buf_size - have, MAX_STORED);
    min_block = MIN(have, s->w_size);
    left = (int)s->strstart - s->block_start;
    if (left >= min_block || ((left || flush == Z_FINISH) && flush != Z_NO_FLUSH && s->strm->avail_in == 0 && left <= have)) {
        len = MIN(left, have);
        last = flush == Z_FINISH && s->strm->avail_in == 0 && len == left ? 1 : 0;
        zng_tr_stored_block(s, (char *)s->window + s->block_start, len, last);
        s->block_start += (int)len;
        PREFIX(flush_pending)(s->strm);
    }

    /* We've done all we can with the available input and output. */
    return last ? finish_started : need_more;
}